

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::DoTableCopy(Thread *this,Instr instr,Ptr *out_trap)

{
  Store *pSVar1;
  bool bVar2;
  u32 dst_offset;
  RefVec *pRVar3;
  const_reference pvVar4;
  Table *dst_00;
  Table *src_00;
  allocator<char> local_b9;
  string local_b8;
  Ptr local_98;
  Enum local_7c;
  u64 local_78;
  u64 dst;
  u64 src;
  u64 size;
  undefined1 local_58 [8];
  Ptr table_src;
  undefined1 local_38 [8];
  Ptr table_dst;
  Ptr *out_trap_local;
  Thread *this_local;
  
  pSVar1 = this->store_;
  table_dst.root_index_ = (Index)out_trap;
  pRVar3 = Instance::tables(this->inst_);
  pvVar4 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                     (pRVar3,(ulong)instr.field_2.imm_u32);
  table_src.root_index_ = pvVar4->index;
  RefPtr<wabt::interp::Table>::RefPtr
            ((RefPtr<wabt::interp::Table> *)local_38,pSVar1,(Ref)table_src.root_index_);
  pSVar1 = this->store_;
  pRVar3 = Instance::tables(this->inst_);
  pvVar4 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                     (pRVar3,(ulong)instr.field_2.imm_u32x2.snd);
  size = pvVar4->index;
  RefPtr<wabt::interp::Table>::RefPtr((RefPtr<wabt::interp::Table> *)local_58,pSVar1,(Ref)size);
  src = PopPtr(this,(Ptr *)local_58);
  dst = PopPtr(this,(Ptr *)local_58);
  local_78 = PopPtr(this,(Ptr *)local_38);
  pSVar1 = this->store_;
  dst_00 = RefPtr<wabt::interp::Table>::operator*((RefPtr<wabt::interp::Table> *)local_38);
  dst_offset = (u32)local_78;
  src_00 = RefPtr<wabt::interp::Table>::operator*((RefPtr<wabt::interp::Table> *)local_58);
  local_7c = (Enum)Table::Copy(pSVar1,dst_00,dst_offset,src_00,(u32)dst,(u32)src);
  bVar2 = Failed((Result)local_7c);
  if (bVar2) {
    pSVar1 = this->store_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"out of bounds table access: table.copy out of bounds",&local_b9)
    ;
    Trap::New(&local_98,pSVar1,&local_b8,&this->frames_);
    RefPtr<wabt::interp::Trap>::operator=
              ((RefPtr<wabt::interp::Trap> *)table_dst.root_index_,&local_98);
    this_local._4_4_ = Trap;
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
  }
  else {
    this_local._4_4_ = Ok;
  }
  RefPtr<wabt::interp::Table>::~RefPtr((RefPtr<wabt::interp::Table> *)local_58);
  RefPtr<wabt::interp::Table>::~RefPtr((RefPtr<wabt::interp::Table> *)local_38);
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoTableCopy(Instr instr, Trap::Ptr* out_trap) {
  Table::Ptr table_dst{store_, inst_->tables()[instr.imm_u32x2.fst]};
  Table::Ptr table_src{store_, inst_->tables()[instr.imm_u32x2.snd]};
  u64 size = PopPtr(table_src);
  u64 src = PopPtr(table_src);
  u64 dst = PopPtr(table_dst);
  TRAP_IF(Failed(Table::Copy(store_, *table_dst, dst, *table_src, src, size)),
          "out of bounds table access: table.copy out of bounds");
  return RunResult::Ok;
}